

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O3

void __thiscall Funcdata::clearCallSpecs(Funcdata *this)

{
  FuncCallSpecs *this_00;
  pointer pPVar1;
  pointer pcVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  ulong uVar5;
  
  ppFVar3 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar4 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar4 != ppFVar3) {
    uVar5 = 0;
    do {
      this_00 = ppFVar3[uVar5];
      if (this_00 != (FuncCallSpecs *)0x0) {
        pPVar1 = (this_00->activeoutput).trial.
                 super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pPVar1 != (pointer)0x0) {
          operator_delete(pPVar1);
        }
        pPVar1 = (this_00->activeinput).trial.
                 super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pPVar1 != (pointer)0x0) {
          operator_delete(pPVar1);
        }
        pcVar2 = (this_00->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(this_00->name).field_2) {
          operator_delete(pcVar2);
        }
        FuncProto::~FuncProto(&this_00->super_FuncProto);
      }
      operator_delete(this_00);
      uVar5 = uVar5 + 1;
      ppFVar3 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppFVar4 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar5 < (ulong)((long)ppFVar4 - (long)ppFVar3 >> 3));
  }
  if (ppFVar4 != ppFVar3) {
    (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar3;
  }
  return;
}

Assistant:

void Funcdata::clearCallSpecs(void)

{
  int4 i;

  for(i=0;i<qlst.size();++i)
    delete qlst[i];		// Delete each func_callspec

  qlst.clear();			// Delete list of pointers
}